

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int accessPayload(BtCursor *pCur,u32 offset,u32 amt,uchar *pBuf,int eOp)

{
  ushort uVar1;
  undefined4 uVar2;
  MemPage *pMVar3;
  BtShared *pBt;
  u8 *puVar4;
  Pager *pPVar5;
  ulong uVar6;
  DbPage *pDbPage_00;
  uint uVar7;
  int iVar8;
  int iVar9;
  Pgno *pPVar10;
  sqlite3_io_methods *psVar11;
  long lVar12;
  u32 nByte;
  sqlite3_file *psVar13;
  u32 uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  uchar *local_68;
  DbPage *pDbPage;
  u32 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pMVar3 = pCur->pPage;
  if (pMVar3->nCell <= pCur->ix) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      iVar8 = 0x12868;
LAB_0013b276:
      iVar8 = sqlite3CorruptError(iVar8);
      return iVar8;
    }
    goto LAB_0013b65a;
  }
  pBt = pCur->pBt;
  getCellInfo(pCur);
  puVar4 = (pCur->info).pPayload;
  uVar1 = (pCur->info).nLocal;
  uVar7 = (uint)uVar1;
  if ((ulong)(pBt->usableSize - uVar7) < (ulong)((long)puVar4 - (long)pMVar3->aData)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      iVar8 = 0x12877;
      goto LAB_0013b276;
    }
    goto LAB_0013b65a;
  }
  if (uVar7 < offset || uVar7 - offset == 0) {
    uVar17 = (ulong)(offset - uVar1);
    iVar8 = 0;
    local_68 = pBuf;
  }
  else {
    uVar14 = uVar7 - offset;
    if (amt + offset <= (uint)uVar1) {
      uVar14 = amt;
    }
    iVar8 = copyPayload(puVar4 + offset,pBuf,uVar14,eOp,pMVar3->pDbPage);
    local_68 = pBuf + (int)uVar14;
    amt = amt - uVar14;
    uVar17 = 0;
  }
  if ((iVar8 == 0) && (amt != 0)) {
    uVar14 = pBt->usableSize;
    uVar7 = uVar14 - 4;
    uVar1 = (pCur->info).nLocal;
    local_3c = sqlite3Get4byte(puVar4 + uVar1);
    if ((pCur->curFlags & 4) != 0) {
      uVar6 = uVar17 / uVar7;
      lVar12 = 0;
      if (pCur->aOverflow[uVar6] != 0) {
        lVar12 = (long)(int)uVar6;
        local_3c = pCur->aOverflow[lVar12];
        uVar17 = uVar17 % (ulong)uVar7;
      }
LAB_0013b416:
      lVar12 = lVar12 * 4;
      do {
        uVar14 = local_3c;
        uVar16 = (uint)uVar17;
        if (local_3c == 0) {
          iVar8 = 0;
          break;
        }
        if (pBt->nPage < local_3c) {
          iVar8 = 0x128be;
          goto LAB_0013b630;
        }
        pPVar10 = pCur->aOverflow;
        *(u32 *)((long)pPVar10 + lVar12) = local_3c;
        uVar15 = uVar16 - uVar7;
        if (uVar16 < uVar7) {
          nByte = uVar7 - uVar16;
          if (uVar16 + amt <= uVar7) {
            nByte = amt;
          }
          if (eOp == 0 && uVar16 == 0) {
            pPVar5 = pBt->pPager;
            psVar13 = pPVar5->fd;
            psVar11 = psVar13->pMethods;
            if ((psVar11 == (sqlite3_io_methods *)0x0) || (pPVar5->pPCache->pDirty != (PgHdr *)0x0))
            goto LAB_0013b497;
            if (pPVar5->pWal != (Wal *)0x0) {
              pDbPage = (DbPage *)((ulong)pDbPage & 0xffffffff00000000);
              walFindFrame(pPVar5->pWal,local_3c,(u32 *)&pDbPage);
              if ((int)pDbPage != 0) goto LAB_0013b497;
              psVar13 = pPVar5->fd;
              psVar11 = psVar13->pMethods;
            }
            iVar8 = (*psVar11->xDeviceCharacteristics)(psVar13);
            if ((-1 < (short)iVar8) || (puVar4 = local_68 + -4, puVar4 < pBuf)) goto LAB_0013b497;
            psVar13 = pBt->pPager->fd;
            uVar2 = *(undefined4 *)puVar4;
            iVar8 = (*psVar13->pMethods->xRead)
                              (psVar13,puVar4,nByte + 4,(ulong)(uVar14 - 1) * (ulong)pBt->pageSize);
            local_3c = sqlite3Get4byte(puVar4);
            *(undefined4 *)puVar4 = uVar2;
            uVar15 = 0;
          }
          else {
LAB_0013b497:
            pDbPage = (DbPage *)&DAT_aaaaaaaaaaaaaaaa;
            iVar8 = (*pBt->pPager->xGet)(pBt->pPager,uVar14,&pDbPage,(uint)(eOp == 0) * 2);
            pDbPage_00 = pDbPage;
            uVar15 = uVar16;
            if (iVar8 == 0) {
              puVar4 = (u8 *)pDbPage->pData;
              local_3c = sqlite3Get4byte(puVar4);
              iVar8 = copyPayload(puVar4 + (uVar16 + 4),local_68,nByte,eOp,pDbPage_00);
              sqlite3PagerUnref(pDbPage);
              uVar15 = 0;
            }
          }
          amt = amt - nByte;
          if (amt == 0) goto LAB_0013b638;
          local_68 = local_68 + (int)nByte;
        }
        else {
          uVar14 = *(u32 *)((long)pPVar10 + lVar12 + 4);
          if (uVar14 == 0) {
            iVar8 = getOverflowPage(pBt,local_3c,(MemPage **)0x0,&local_3c);
          }
          else {
            iVar8 = 0;
            local_3c = uVar14;
          }
        }
        uVar17 = (ulong)uVar15;
        lVar12 = lVar12 + 4;
      } while (iVar8 == 0);
      goto LAB_0013b61b;
    }
    uVar16 = (((pCur->info).nPayload + (uVar14 - uVar1)) - 5) / uVar7;
    if ((pCur->aOverflow != (Pgno *)0x0) &&
       (iVar8 = (*sqlite3Config.m.xSize)(pCur->aOverflow), (int)(uVar16 * 4) <= iVar8)) {
      pPVar10 = pCur->aOverflow;
LAB_0013b3f4:
      lVar12 = 0;
      memset(pPVar10,0,(long)(int)uVar16 << 2);
      pCur->curFlags = pCur->curFlags | 4;
      goto LAB_0013b416;
    }
    iVar8 = 7;
    if (((sqlite3Config.xTestCallback == (_func_int_int *)0x0) ||
        (iVar9 = (*sqlite3Config.xTestCallback)(0x19d), iVar9 == 0)) &&
       (pPVar10 = (Pgno *)sqlite3Realloc(pCur->aOverflow,(long)(int)(uVar16 * 2) << 2),
       pPVar10 != (Pgno *)0x0)) {
      pCur->aOverflow = pPVar10;
      goto LAB_0013b3f4;
    }
  }
  else {
LAB_0013b61b:
    if ((iVar8 == 0) && (amt != 0)) {
      iVar8 = 0x12912;
LAB_0013b630:
      iVar8 = sqlite3CorruptError(iVar8);
    }
  }
LAB_0013b638:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar8;
  }
LAB_0013b65a:
  __stack_chk_fail();
}

Assistant:

static int accessPayload(
  BtCursor *pCur,      /* Cursor pointing to entry to read from */
  u32 offset,          /* Begin reading this far into payload */
  u32 amt,             /* Read this many bytes */
  unsigned char *pBuf, /* Write the bytes into this buffer */
  int eOp              /* zero to read. non-zero to write. */
){
  unsigned char *aPayload;
  int rc = SQLITE_OK;
  int iIdx = 0;
  MemPage *pPage = pCur->pPage;               /* Btree page of current entry */
  BtShared *pBt = pCur->pBt;                  /* Btree this cursor belongs to */
#ifdef SQLITE_DIRECT_OVERFLOW_READ
  unsigned char * const pBufStart = pBuf;     /* Start of original out buffer */
#endif

  assert( pPage );
  assert( eOp==0 || eOp==1 );
  assert( pCur->eState==CURSOR_VALID );
  if( pCur->ix>=pPage->nCell ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( cursorHoldsMutex(pCur) );

  getCellInfo(pCur);
  aPayload = pCur->info.pPayload;
  assert( offset+amt <= pCur->info.nPayload );

  assert( aPayload > pPage->aData );
  if( (uptr)(aPayload - pPage->aData) > (pBt->usableSize - pCur->info.nLocal) ){
    /* Trying to read or write past the end of the data is an error.  The
    ** conditional above is really:
    **    &aPayload[pCur->info.nLocal] > &pPage->aData[pBt->usableSize]
    ** but is recast into its current form to avoid integer overflow problems
    */
    return SQLITE_CORRUPT_PAGE(pPage);
  }

  /* Check if data must be read/written to/from the btree page itself. */
  if( offset<pCur->info.nLocal ){
    int a = amt;
    if( a+offset>pCur->info.nLocal ){
      a = pCur->info.nLocal - offset;
    }
    rc = copyPayload(&aPayload[offset], pBuf, a, eOp, pPage->pDbPage);
    offset = 0;
    pBuf += a;
    amt -= a;
  }else{
    offset -= pCur->info.nLocal;
  }


  if( rc==SQLITE_OK && amt>0 ){
    const u32 ovflSize = pBt->usableSize - 4;  /* Bytes content per ovfl page */
    Pgno nextPage;

    nextPage = get4byte(&aPayload[pCur->info.nLocal]);

    /* If the BtCursor.aOverflow[] has not been allocated, allocate it now.
    **
    ** The aOverflow[] array is sized at one entry for each overflow page
    ** in the overflow chain. The page number of the first overflow page is
    ** stored in aOverflow[0], etc. A value of 0 in the aOverflow[] array
    ** means "not yet known" (the cache is lazily populated).
    */
    if( (pCur->curFlags & BTCF_ValidOvfl)==0 ){
      int nOvfl = (pCur->info.nPayload-pCur->info.nLocal+ovflSize-1)/ovflSize;
      if( pCur->aOverflow==0
       || nOvfl*(int)sizeof(Pgno) > sqlite3MallocSize(pCur->aOverflow)
      ){
        Pgno *aNew;
        if( sqlite3FaultSim(413) ){
          aNew = 0;
        }else{
          aNew = (Pgno*)sqlite3Realloc(pCur->aOverflow, nOvfl*2*sizeof(Pgno));
        }
        if( aNew==0 ){
          return SQLITE_NOMEM_BKPT;
        }else{
          pCur->aOverflow = aNew;
        }
      }
      memset(pCur->aOverflow, 0, nOvfl*sizeof(Pgno));
      pCur->curFlags |= BTCF_ValidOvfl;
    }else{
      /* Sanity check the validity of the overflow page cache */
      assert( pCur->aOverflow[0]==nextPage
           || pCur->aOverflow[0]==0
           || CORRUPT_DB );
      assert( pCur->aOverflow[0]!=0 || pCur->aOverflow[offset/ovflSize]==0 );

      /* If the overflow page-list cache has been allocated and the
      ** entry for the first required overflow page is valid, skip
      ** directly to it.
      */
      if( pCur->aOverflow[offset/ovflSize] ){
        iIdx = (offset/ovflSize);
        nextPage = pCur->aOverflow[iIdx];
        offset = (offset%ovflSize);
      }
    }

    assert( rc==SQLITE_OK && amt>0 );
    while( nextPage ){
      /* If required, populate the overflow page-list cache. */
      if( nextPage > pBt->nPage ) return SQLITE_CORRUPT_BKPT;
      assert( pCur->aOverflow[iIdx]==0
              || pCur->aOverflow[iIdx]==nextPage
              || CORRUPT_DB );
      pCur->aOverflow[iIdx] = nextPage;

      if( offset>=ovflSize ){
        /* The only reason to read this page is to obtain the page
        ** number for the next page in the overflow chain. The page
        ** data is not required. So first try to lookup the overflow
        ** page-list cache, if any, then fall back to the getOverflowPage()
        ** function.
        */
        assert( pCur->curFlags & BTCF_ValidOvfl );
        assert( pCur->pBtree->db==pBt->db );
        if( pCur->aOverflow[iIdx+1] ){
          nextPage = pCur->aOverflow[iIdx+1];
        }else{
          rc = getOverflowPage(pBt, nextPage, 0, &nextPage);
        }
        offset -= ovflSize;
      }else{
        /* Need to read this page properly. It contains some of the
        ** range of data that is being read (eOp==0) or written (eOp!=0).
        */
        int a = amt;
        if( a + offset > ovflSize ){
          a = ovflSize - offset;
        }

#ifdef SQLITE_DIRECT_OVERFLOW_READ
        /* If all the following are true:
        **
        **   1) this is a read operation, and
        **   2) data is required from the start of this overflow page, and
        **   3) there are no dirty pages in the page-cache
        **   4) the database is file-backed, and
        **   5) the page is not in the WAL file
        **   6) at least 4 bytes have already been read into the output buffer
        **
        ** then data can be read directly from the database file into the
        ** output buffer, bypassing the page-cache altogether. This speeds
        ** up loading large records that span many overflow pages.
        */
        if( eOp==0                                             /* (1) */
         && offset==0                                          /* (2) */
         && sqlite3PagerDirectReadOk(pBt->pPager, nextPage)    /* (3,4,5) */
         && &pBuf[-4]>=pBufStart                               /* (6) */
        ){
          sqlite3_file *fd = sqlite3PagerFile(pBt->pPager);
          u8 aSave[4];
          u8 *aWrite = &pBuf[-4];
          assert( aWrite>=pBufStart );                         /* due to (6) */
          memcpy(aSave, aWrite, 4);
          rc = sqlite3OsRead(fd, aWrite, a+4, (i64)pBt->pageSize*(nextPage-1));
          nextPage = get4byte(aWrite);
          memcpy(aWrite, aSave, 4);
        }else
#endif

        {
          DbPage *pDbPage;
          rc = sqlite3PagerGet(pBt->pPager, nextPage, &pDbPage,
              (eOp==0 ? PAGER_GET_READONLY : 0)
          );
          if( rc==SQLITE_OK ){
            aPayload = sqlite3PagerGetData(pDbPage);
            nextPage = get4byte(aPayload);
            rc = copyPayload(&aPayload[offset+4], pBuf, a, eOp, pDbPage);
            sqlite3PagerUnref(pDbPage);
            offset = 0;
          }
        }
        amt -= a;
        if( amt==0 ) return rc;
        pBuf += a;
      }
      if( rc ) break;
      iIdx++;
    }
  }

  if( rc==SQLITE_OK && amt>0 ){
    /* Overflow chain ends prematurely */
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  return rc;
}